

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0>::
value_help(enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *this,
          ostream *ostr)

{
  size_type sVar1;
  iterator pvVar2;
  iterator pvVar3;
  pointer pbVar4;
  bool bVar5;
  long *local_58;
  long local_50;
  long local_48 [2];
  pointer local_38;
  
  sVar1 = (this->
          super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>).
          super_basic_param.p_value_hint._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,(this->
                    super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>
                    ).super_basic_param.p_value_hint._M_dataplus._M_p,sVar1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"<",1);
  pbVar4 = (this->m_valid_names).
           super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_valid_names).
             super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != local_38) {
    bVar5 = true;
    do {
      pvVar2 = pbVar4->m_begin;
      pvVar3 = pbVar4->m_end;
      if (bVar5) {
        bVar5 = false;
      }
      else {
        local_58 = (long *)CONCAT71(local_58._1_7_,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)&local_58,1);
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pvVar2,pvVar3);
      std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)local_58,local_50);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,">",1);
  return;
}

Assistant:

virtual void    value_help( std::ostream& ostr ) const
    {
        if( this->p_value_hint.empty() ) {
            ostr << "<";
            bool first = true;
            BOOST_TEST_FOREACH( cstring, name, m_valid_names ) {
                if( first )
                    first = false;
                else
                    ostr << '|';
                ostr << name;
            }
            ostr << ">";
        }
        else
            ostr << this->p_value_hint;
    }